

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.h
# Opt level: O3

void __thiscall Group::print(Group *this,int day_id)

{
  Lesson *pLVar1;
  char cVar2;
  ostream *poVar3;
  long *plVar4;
  Lesson *pLVar5;
  size_t sVar6;
  Lesson lesson;
  Lesson local_d8;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"group_id:",9);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(this->groupNumber)._M_dataplus._M_p,
                      (this->groupNumber)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  sVar6 = 0;
  do {
    if ((byte)((char)sVar6 * -0x49) < 0x25) {
      cVar2 = (char)(((uint)sVar6 & 0xff) * 0x25 >> 8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Day: ",5);
      plVar4 = (long *)std::ostream::operator<<
                                 ((ostream *)&std::cout,
                                  (uint)((byte)(((byte)((char)sVar6 - cVar2) >> 1) + cVar2) >> 2));
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
    }
    pLVar1 = (this->lesson_map).super__Vector_base<Lesson,_std::allocator<Lesson>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pLVar5 = (this->lesson_map).super__Vector_base<Lesson,_std::allocator<Lesson>_>._M_impl.
                  super__Vector_impl_data._M_start; pLVar5 != pLVar1; pLVar5 = pLVar5 + 1) {
      Lesson::Lesson(&local_d8,pLVar5);
      if (local_d8.lesson_id == sVar6) {
        Lesson::print(&local_d8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8.time._M_dataplus._M_p != &local_d8.time.field_2) {
        operator_delete(local_d8.time._M_dataplus._M_p,
                        local_d8.time.field_2._M_allocated_capacity + 1);
      }
      std::vector<Professor,_std::allocator<Professor>_>::~vector(&local_d8.prep_list);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8.professor._M_dataplus._M_p != &local_d8.professor.field_2) {
        operator_delete(local_d8.professor._M_dataplus._M_p,
                        local_d8.professor.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8.room._M_dataplus._M_p != &local_d8.room.field_2) {
        operator_delete(local_d8.room._M_dataplus._M_p,
                        local_d8.room.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8.subject._M_dataplus._M_p != &local_d8.subject.field_2) {
        operator_delete(local_d8.subject._M_dataplus._M_p,
                        local_d8.subject.field_2._M_allocated_capacity + 1);
      }
    }
    sVar6 = sVar6 + 1;
  } while (sVar6 != 0x2a);
  return;
}

Assistant:

void Group::print(int day_id) {

    std::cout << "group_id:" << groupNumber << std::endl;

    for (int i = 0; i < 42; i++) {
        if(i % 7 == 0)
            std::cout << "Day: " << i / 7 << std::endl
                         ;
        for (auto lesson: lesson_map) {
            if(lesson.lesson_id == i) {
                lesson.print();
            }

        }
    }

}